

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::grow(DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
       *this,uint AtLeast)

{
  uint uVar1;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *OldBucketsBegin;
  uint Num;
  uint64_t uVar2;
  
  uVar1 = this->NumBuckets;
  OldBucketsBegin = this->Buckets;
  uVar2 = NextPowerOf2((ulong)(AtLeast - 1));
  Num = 0x40;
  if (0x40 < (uint)uVar2) {
    Num = (uint)uVar2;
  }
  allocateBuckets(this,Num);
  if (this->Buckets != (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
    if (OldBucketsBegin != (DenseMapPair<llbuild::core::KeyID,_DBKeyID> *)0x0) {
      DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
      ::moveFromOldBuckets
                ((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                  *)this,OldBucketsBegin,OldBucketsBegin + uVar1);
      operator_delete(OldBucketsBegin);
      return;
    }
    DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
    ::initEmpty((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                 *)this);
    return;
  }
  __assert_fail("Buckets",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x2dd,
                "void llvm::DenseMap<llbuild::core::KeyID, DBKeyID>::grow(unsigned int) [KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, BucketT = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>]"
               );
}

Assistant:

void grow(unsigned AtLeast) {
    unsigned OldNumBuckets = NumBuckets;
    BucketT *OldBuckets = Buckets;

    allocateBuckets(std::max<unsigned>(64, static_cast<unsigned>(NextPowerOf2(AtLeast-1))));
    assert(Buckets);
    if (!OldBuckets) {
      this->BaseT::initEmpty();
      return;
    }

    this->moveFromOldBuckets(OldBuckets, OldBuckets+OldNumBuckets);

    // Free the old table.
    operator delete(OldBuckets);
  }